

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::popScope(AVisitor<hiberlite::KillChildren> *this)

{
  size_type sVar1;
  runtime_error *this_00;
  _Elt_pointer pSVar2;
  
  sVar1 = std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::size(&(this->stack).c);
  if (sVar1 != 0) {
    pSVar2 = (this->stack).c.super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar2 == (this->stack).c.
                  super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pSVar2 = (this->stack).c.
               super__Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 7;
    }
    Scope::operator=(&this->scope,pSVar2 + -1);
    std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::pop_back(&(this->stack).c);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"popScope with empty stack");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AVisitor<C>::popScope()
{
	if(!stack.size())
		throw std::runtime_error("popScope with empty stack");
	scope=stack.top();
	stack.pop();
}